

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseRAPass::addBlock(BaseRAPass *this,RABlock *block)

{
  Error EVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = *(uint *)&this->field_0xb8;
  uVar3 = *(uint *)&this->field_0xbc;
  if (uVar3 == uVar2) {
    EVar1 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_blocks,&this->_allocator,8,1);
    if (EVar1 != 0) {
      return EVar1;
    }
    uVar2 = *(uint *)&this->field_0xb8;
    uVar3 = *(uint *)&this->field_0xbc;
  }
  *(uint *)(block + 8) = uVar2;
  if (uVar2 < uVar3) {
    *(RABlock **)(*(long *)&this->_blocks + (ulong)uVar2 * 8) = block;
    *(int *)&this->field_0xb8 = *(int *)&this->field_0xb8 + 1;
    return 0;
  }
  addBlock();
  return 3;
}

Assistant:

Error BaseRAPass::addBlock(RABlock* block) noexcept {
  ASMJIT_PROPAGATE(_blocks.willGrow(allocator()));

  block->_blockId = blockCount();
  _blocks.appendUnsafe(block);
  return kErrorOk;
}